

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O2

int open_file(char *filename,coda_product **product_file,int force_binary)

{
  ulong uVar1;
  long lVar2;
  undefined7 uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [12];
  unkbyte10 Var6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  undefined4 uVar10;
  coda_cursor *cursor;
  ulong offset;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  char cVar15;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  coda_product *product;
  uchar buffer [80];
  coda_cursor local_340;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar16 [13];
  undefined1 auVar18 [16];
  undefined1 auVar24 [16];
  undefined1 auVar20 [16];
  undefined1 auVar19 [16];
  undefined2 uVar28;
  
  if (filename == (char *)0x0) {
    __assert_fail("filename != NULL && file_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                  ,0x9d,"int get_file_size(const char *, int64_t *)");
  }
  iVar7 = stat(filename,(stat *)&local_340);
  if (iVar7 != 0) {
    piVar8 = __errno_location();
    if (*piVar8 != 2) {
      pcVar9 = strerror(*piVar8);
      coda_set_error(-0x15,"could not open %s (%s)",filename,pcVar9);
      return -1;
    }
    pcVar9 = "could not find %s";
    iVar7 = -0x14;
LAB_001135ff:
    coda_set_error(iVar7,pcVar9,filename);
    return -1;
  }
  if ((local_340.stack[0].index._1_1_ & 0x80) == 0) {
    pcVar9 = "could not open %s (not a regular file)";
    iVar7 = -0x15;
    goto LAB_001135ff;
  }
  iVar7 = coda_bin_open(filename,local_340.stack[1].index,&product);
  if (iVar7 != 0) {
    return -1;
  }
  if (force_binary != 0) goto LAB_00113647;
  uVar1 = product->file_size;
  iVar7 = coda_cursor_set_product(&local_340,product);
  if (iVar7 != 0) goto LAB_0011366a;
  if ((long)uVar1 < 4) goto LAB_00113647;
  iVar7 = coda_cursor_read_bytes(&local_340,buffer,0,4);
  if (iVar7 != 0) goto LAB_0011366a;
  iVar7 = bcmp(buffer,"CDF",3);
  if (((iVar7 == 0) && ((buffer._3_4_ & 0xff) < 6)) && ((0x26U >> (buffer._3_4_ & 0x1f) & 1) != 0))
  {
    iVar7 = coda_netcdf_reopen(&product);
  }
  else {
    if (CONCAT13(buffer[3],CONCAT12(buffer[2],CONCAT11(buffer[1],buffer[0]))) == 0x113030e) {
      iVar7 = -0xb;
LAB_001136ca:
      coda_set_error(iVar7,(char *)0x0);
LAB_0011366a:
      coda_close(product);
      return -1;
    }
    if (uVar1 < 8) goto LAB_00113647;
    iVar7 = coda_cursor_read_bytes(&local_340,buffer + 4,4,4);
    if (iVar7 != 0) goto LAB_0011366a;
    uVar3 = CONCAT43(buffer._3_4_,CONCAT12(buffer[2],CONCAT11(buffer[1],buffer[0])));
    lVar2 = CONCAT17(buffer[7],uVar3);
    if (((lVar2 == -0xfffffeff0c33) || (lVar2 == -0xfffffd9f0d33)) ||
       ((lVar2 == -0xffff00010000 || ((lVar2 == 0x100cccc0100f3cd || (lVar2 == 0x100cccc0260f2cd))))
       )) {
      iVar7 = coda_cdf_reopen(&product);
    }
    else {
      if (lVar2 == 0xa1a0a0d46444889) {
LAB_00113785:
        iVar7 = -0xd;
        goto LAB_001136ca;
      }
      if (((int)uVar3 == 0x42495247) && ((byte)(buffer[7] - 1) < 2)) {
        iVar7 = coda_grib_reopen(&product);
      }
      else {
        iVar7 = bcmp(buffer,"<?xml",5);
        if ((lVar2 == 0x6c6d783f3cbfbbef) || (iVar7 == 0)) {
          iVar7 = coda_xml_reopen(&product);
        }
        else {
          if (uVar1 < 0x28) goto LAB_00113647;
          cursor = &local_340;
          iVar7 = coda_cursor_read_bytes(cursor,buffer + 8,8,0x20);
          if (iVar7 != 0) goto LAB_0011366a;
          if (((0x3b < uVar1) && (buffer[0] == '#')) && ((byte)(buffer[1] + 0x9f) < 3)) {
            bVar11 = (uchar)buffer._3_4_ - 0x3a;
            bVar12 = SUB41(buffer._3_4_,1) - 0x3a;
            bVar13 = SUB41(buffer._3_4_,2) - 0x3a;
            bVar14 = SUB41(buffer._3_4_,3) - 0x3a;
            cVar15 = -((byte)((0xf6 < bVar11) * bVar11 | (0xf6 >= bVar11) * -10) == bVar11);
            cVar25 = -((byte)((0xf6 < bVar12) * bVar12 | (0xf6 >= bVar12) * -10) == bVar12);
            cVar26 = -((byte)((0xf6 < bVar13) * bVar13 | (0xf6 >= bVar13) * -10) == bVar13);
            cVar27 = -((byte)((0xf6 < bVar14) * bVar14 | (0xf6 >= bVar14) * -10) == bVar14);
            auVar16._0_12_ = ZEXT512(0xffffffffff) << 0x38;
            auVar16[0xc] = 0xff;
            auVar20[0xd] = 0xff;
            auVar20._0_13_ = auVar16;
            auVar20[0xe] = 0xff;
            auVar20[0xf] = 0xff;
            auVar19._14_2_ = auVar20._14_2_;
            auVar19[0xd] = 0xff;
            auVar19._0_13_ = auVar16;
            auVar18._13_3_ = auVar19._13_3_;
            auVar18[0xc] = 0xff;
            auVar18._0_12_ = auVar16._0_12_;
            Var6 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45
                                                  (auVar18._12_4_,0xffffffffff) >> 0x20),0xffffffff)
                                                  >> 0x18),0xffffff) >> 0x10),0xffff) >> 8),cVar27),
                            cVar27);
            auVar5._2_10_ = Var6;
            auVar5[1] = cVar26;
            auVar5[0] = cVar26;
            auVar4._2_12_ = auVar5;
            auVar4[1] = cVar25;
            auVar4[0] = cVar25;
            auVar17._0_2_ = CONCAT11(cVar15,cVar15);
            auVar17._2_14_ = auVar4;
            uVar28 = (undefined2)Var6;
            auVar24._0_12_ = auVar17._0_12_;
            auVar24._12_2_ = uVar28;
            auVar24._14_2_ = uVar28;
            auVar23._12_4_ = auVar24._12_4_;
            auVar23._0_10_ = auVar17._0_10_;
            auVar23._10_2_ = auVar5._0_2_;
            auVar22._10_6_ = auVar23._10_6_;
            auVar22._0_8_ = auVar17._0_8_;
            auVar22._8_2_ = auVar5._0_2_;
            auVar21._8_8_ = auVar22._8_8_;
            auVar21._6_2_ = auVar4._0_2_;
            auVar21._4_2_ = auVar4._0_2_;
            auVar21._2_2_ = auVar17._0_2_;
            auVar21._0_2_ = auVar17._0_2_;
            uVar10 = movmskps((int)cursor,auVar21);
            if ((((buffer[2] == 'P' || buffer[2] == 'V') &&
                 (((char)uVar10 == '\x0f' && (buffer[10] == ' ' && buffer[7] == ' ')) &&
                  buffer[0xd] == ' ')) &&
                ((buffer[0x10] == ' ' && ((buffer[0x13] == ' ' && (buffer[0x1f] == ' ')))))) &&
               (buffer[0x27] == ' ')) {
              iVar7 = coda_sp3_reopen(&product);
              goto LAB_001136f2;
            }
          }
          if (uVar1 < 0x50) goto LAB_00113647;
          iVar7 = coda_cursor_read_bytes(&local_340,buffer,0x3c,0x14);
          if (iVar7 != 0) goto LAB_0011366a;
          iVar7 = bcmp(buffer,"RINEX VERSION / TYPE",0x14);
          if (iVar7 != 0) {
            offset = 0x200;
            do {
              if ((long)uVar1 <= (long)(offset | 8)) goto LAB_00113647;
              iVar7 = coda_cursor_read_bytes(&local_340,buffer,offset,8);
              if (iVar7 != 0) goto LAB_0011366a;
              offset = offset * 2;
            } while (CONCAT17(buffer[7],
                              CONCAT43(buffer._3_4_,
                                       CONCAT12(buffer[2],CONCAT11(buffer[1],buffer[0])))) !=
                     0xa1a0a0d46444889);
            goto LAB_00113785;
          }
          iVar7 = coda_rinex_reopen(&product);
        }
      }
    }
  }
LAB_001136f2:
  if (iVar7 != 0) {
    return -1;
  }
LAB_00113647:
  *product_file = product;
  return 0;
}

Assistant:

static int get_file_size(const char *filename, int64_t *file_size)
{
    struct stat statbuf;

    assert(filename != NULL && file_size != NULL);

    /* stat() the file to be opened */

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            coda_set_error(CODA_ERROR_FILE_NOT_FOUND, "could not find %s", filename);
        }
        else
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (%s)", filename, strerror(errno));
        }
        return -1;
    }

    /* check that the file is a regular file */

    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (not a regular file)", filename);
        return -1;
    }

    /* get file size */

    *file_size = statbuf.st_size;

    return 0;
}